

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O2

void __thiscall unittest::UnitTest::TestHashComment2(UnitTest *this)

{
  int iVar1;
  mapped_type *this_00;
  mapped_type *a;
  allocator<char> local_26b;
  allocator<char> local_26a;
  allocator<char> local_269;
  key_type local_268;
  key_type local_248;
  shared_ptr<inipp::Format<char>_> fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  __shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2> local_1f8;
  Ini<char> ini;
  istringstream ss;
  
  ss = (istringstream)0x5b;
  ini.sections._M_t._M_impl._0_1_ = 0x5d;
  local_268._M_dataplus._M_p._0_1_ = 0x3d;
  local_248._M_dataplus._M_p._0_1_ = 0x23;
  local_218._M_dataplus._M_p._0_1_ = 0x24;
  local_269 = (allocator<char>)0x7b;
  local_26a = (allocator<char>)0x3a;
  local_26b = (allocator<char>)0x7d;
  std::make_shared<inipp::Format<char>,char,char,char,char,char,char,char,char>
            ((char *)&fmt.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>,
             (char *)&ss,(char *)&ini,(char *)&local_268,(char *)&local_248,(char *)&local_218,
             (char *)&local_269,(char *)&local_26a);
  std::__shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1f8,&fmt.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>);
  inipp::Ini<char>::Ini(&ini,(shared_ptr<inipp::Format<char>_> *)&local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
  iVar1 = (*(ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_Format[3])
                    (ini.format.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,0x23);
  Assert::IsTrue(SUB41(iVar1,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"# hello world\n[default]\na=2",(allocator<char> *)&local_248);
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&local_268,_S_in);
  std::__cxx11::string::~string((string *)&local_268);
  inipp::Ini<char>::parse(&ini,(basic_istream<char,_std::char_traits<char>_> *)&ss);
  WriteMessage<char>(&ini);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"default",&local_269);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::at(&ini.sections,&local_268);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"a",&local_26a);
  a = std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::at(this_00,&local_248);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"2",&local_26b);
  Assert::AreEqual<std::__cxx11::string>(a,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  Assert::IsTrue(ini.errors.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&ini.errors);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  inipp::Ini<char>::~Ini(&ini);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fmt.super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST_METHOD(TestHashComment2)
		{
			auto fmt = std::make_shared<Format<char>>('[', ']', '=', '#', '$', '{', ':', '}');
			Ini<char> ini(fmt);
			Assert::IsTrue(ini.format->is_comment('#'));
			std::istringstream ss("# hello world\n[default]\na=2");
			ini.parse(ss);
			WriteMessage(ini);
			Assert::AreEqual(ini.sections.at("default").at("a"), std::string("2"));
			Assert::IsTrue(ini.errors.empty());
		}